

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

void removeStringImpl<QStringView>(QString *s,QStringView *needle,CaseSensitivity cs)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QArrayData *data;
  qsizetype qVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  char16_t *pcVar8;
  long lVar9;
  char16_t *pcVar10;
  long lVar11;
  char16_t *pcVar12;
  size_t __n;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView haystack0;
  QStringView haystack0_00;
  QStringView haystack0_01;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar11 = needle->m_size;
  if (lVar11 != 0) {
    pcVar2 = (s->d).ptr;
    qVar7 = (s->d).size;
    QVar13.m_data = needle->m_data;
    QVar13.m_size = lVar11;
    haystack0.m_data = pcVar2;
    haystack0.m_size = qVar7;
    qVar5 = QtPrivate::findString(haystack0,0,QVar13,cs);
    if (-1 < qVar5) {
      pcVar1 = pcVar2 + qVar7;
      pDVar3 = (s->d).d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString(&local_58,qVar7,Uninitialized);
        if ((local_58.d.d == (Data *)0x0) ||
           (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(&local_58,local_58.d.size,KeepSize);
        }
        pcVar10 = local_58.d.ptr;
        pcVar12 = local_58.d.ptr;
        if (qVar5 != 0) {
          lVar9 = qVar5 + 1;
          pcVar8 = pcVar2;
          do {
            *pcVar12 = *pcVar8;
            pcVar8 = pcVar8 + 1;
            pcVar12 = pcVar12 + 1;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        pcVar8 = pcVar2 + qVar5 + lVar11;
        if (pcVar8 < pcVar1) {
          QVar13 = *needle;
          pcVar4 = (s->d).ptr;
          qVar7 = (s->d).size;
          do {
            haystack0_00.m_data = pcVar4;
            haystack0_00.m_size = qVar7;
            qVar5 = QtPrivate::findString(haystack0_00,(long)pcVar8 - (long)pcVar2 >> 1,QVar13,cs);
            pcVar6 = pcVar2 + qVar5;
            if (qVar5 == -1) {
              pcVar6 = pcVar1;
            }
            lVar9 = (long)pcVar6 - (long)pcVar8 >> 1;
            if (0 < lVar9) {
              lVar9 = lVar9 + 1;
              do {
                *pcVar12 = *pcVar8;
                pcVar8 = pcVar8 + 1;
                pcVar12 = pcVar12 + 1;
                lVar9 = lVar9 + -1;
              } while (1 < lVar9);
            }
            pcVar8 = pcVar6 + lVar11;
          } while (pcVar8 < pcVar1);
        }
        QString::resize(&local_58,(long)pcVar12 - (long)pcVar10 >> 1);
        data = &((s->d).d)->super_QArrayData;
        pcVar2 = (s->d).ptr;
        (s->d).d = local_58.d.d;
        (s->d).ptr = local_58.d.ptr;
        qVar7 = (s->d).size;
        (s->d).size = local_58.d.size;
        local_58.d.d = (Data *)data;
        local_58.d.ptr = pcVar2;
        local_58.d.size = qVar7;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
      }
      else {
        pcVar10 = pcVar2 + qVar5;
        pcVar12 = pcVar10;
        while (pcVar8 = pcVar12 + lVar11, pcVar8 < pcVar1) {
          haystack0_01.m_data = (s->d).ptr;
          haystack0_01.m_size = (s->d).size;
          qVar7 = QtPrivate::findString(haystack0_01,(long)pcVar8 - (long)pcVar2 >> 1,*needle,cs);
          pcVar12 = pcVar2 + qVar7;
          if (qVar7 == -1) {
            pcVar12 = pcVar1;
          }
          __n = (long)pcVar12 - (long)pcVar8;
          if (__n != 0) {
            memmove(pcVar10,pcVar8,__n);
          }
          pcVar10 = (char16_t *)((long)pcVar10 + __n);
        }
        lVar11 = (long)pcVar10 - (long)pcVar2 >> 1;
        if (lVar11 < (s->d).size) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            QString::resize(s,lVar11);
            return;
          }
          goto LAB_0032cc91;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0032cc91:
  __stack_chk_fail();
}

Assistant:

static void removeStringImpl(QString &s, const T &needle, Qt::CaseSensitivity cs)
{
    const auto needleSize = needle.size();
    if (!needleSize)
        return;

    // avoid detach if nothing to do:
    qsizetype i = s.indexOf(needle, 0, cs);
    if (i < 0)
        return;

    QString::DataPointer &dptr = s.data_ptr();
    auto begin = dptr.begin();
    auto end = dptr.end();

    auto copyFunc = [&](auto &dst) {
        auto src = begin + i + needleSize;
        while (src < end) {
            i = s.indexOf(needle, std::distance(begin, src), cs);
            auto hit = i == -1 ? end : begin + i;
            dst = std::copy(src, hit, dst);
            src = hit + needleSize;
        }
        return dst;
    };

    if (!dptr->needsDetach()) {
        auto dst = begin + i;
        dst = copyFunc(dst);
        s.truncate(std::distance(begin, dst));
    } else {
        QString copy{s.size(), Qt::Uninitialized};
        auto copy_begin = copy.begin();
        auto dst = std::copy(begin, begin + i, copy_begin); // Chunk before the first hit
        dst = copyFunc(dst);
        copy.resize(std::distance(copy_begin, dst));
        s.swap(copy);
    }
}